

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recommend.cc
# Opt level: O0

int bf_hit(char *bf,char *line)

{
  char *in_RSI;
  long in_RDI;
  uint hashv [2];
  uint i;
  size_t in_stack_ffffffffffffffc8;
  uint local_24 [5];
  long local_10;
  
  local_10 = in_RDI;
  strlen(in_RSI);
  get_hashv(in_RSI,in_stack_ffffffffffffffc8,(uint *)0x11a014);
  local_24[2] = 0;
  while( true ) {
    if (1 < local_24[2]) {
      return 1;
    }
    if (((int)*(char *)(local_10 + (ulong)(local_24[local_24[2]] >> 3)) &
        1 << ((byte)local_24[local_24[2]] & 7)) == 0) break;
    local_24[2] = local_24[2] + 1;
  }
  return 0;
}

Assistant:

int bf_hit(char *bf, char *line)
{ unsigned i, hashv[NUM_HASHES];
  get_hashv(line,strlen(line),hashv);
  for(i=0; i<NUM_HASHES; i++)
  { if (BIT_TEST(bf,hashv[i])==0) return 0;
  }
  return 1;
}